

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManProfileTruths(Mf_Man_t *p)

{
  int *piVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Vec_Mem_t *pVVar4;
  int iVar5;
  void *__s;
  Gia_Obj_t *pGVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  iVar2 = (p->vCnfSizes).nSize;
  iVar5 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar5 = iVar2;
  }
  if ((iVar5 == 0) || (__s = malloc((long)iVar5 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)iVar2 * 4);
  }
  pGVar3 = p->pGia;
  iVar5 = pGVar3->nObjs;
  if (0 < iVar5) {
    pGVar6 = pGVar3->pObjs;
    lVar7 = 0;
    lVar9 = 0;
    do {
      if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
         (0xffff < *(uint *)(&p->pLfObjs->field_0xc + lVar7))) {
        uVar10 = *(uint *)((long)&p->pLfObjs->iCutSet + lVar7);
        uVar11 = (int)uVar10 >> 0x10;
        if (((int)uVar11 < 0) || ((p->vPages).nSize <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar10 = *(uint *)((long)(p->vPages).pArray[uVar11] + (ulong)(uVar10 & 0xffff) * 4 + 4) >> 6
        ;
        if (iVar2 <= (int)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)__s + (ulong)uVar10 * 4);
        *piVar1 = *piVar1 + 1;
        iVar5 = pGVar3->nObjs;
      }
      lVar9 = lVar9 + 1;
      pGVar6 = pGVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar9 < iVar5);
  }
  if (iVar2 < 1) {
    if (__s == (void *)0x0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    uVar10 = 0;
    do {
      uVar11 = *(uint *)((long)__s + uVar8 * 4);
      if (uVar11 != 0) {
        printf("%6d : ",(ulong)uVar10);
        printf("%6d : ",uVar8 & 0xffffffff);
        printf("Occur = %4d  ",(ulong)uVar11);
        if ((long)(p->vCnfSizes).nSize <= (long)uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("CNF size = %2d  ",(ulong)(uint)(p->vCnfSizes).pArray[uVar8]);
        pVVar4 = p->vTtMem;
        if ((long)pVVar4->nEntries <= (long)uVar8) {
          __assert_fail("i >= 0 && i < p->nEntries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                        ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
        }
        uVar10 = uVar10 + 1;
        Dau_DsdPrintFromTruth
                  (pVVar4->ppPages[(uint)uVar8 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                   (long)(int)(pVVar4->PageMask & (uint)uVar8) * (long)pVVar4->nEntrySize,
                   p->pPars->nLutSize);
      }
      uVar8 = uVar8 + 1;
    } while ((long)iVar2 != uVar8);
  }
  free(__s);
  return;
}

Assistant:

void Mf_ManProfileTruths( Mf_Man_t * p )
{
    Vec_Int_t * vCounts;
    int i, Entry, * pCut, Counter = 0;
    vCounts = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntAddToEntry( vCounts, Abc_Lit2Var(Mf_CutFunc(pCut)), 1 );
    }
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        printf( "%6d : ", Counter++ );
        printf( "%6d : ", i );
        printf( "Occur = %4d  ", Entry ); 
        printf( "CNF size = %2d  ", Vec_IntEntry(&p->vCnfSizes, i) );
        Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, i), p->pPars->nLutSize );
    }
    Vec_IntFree( vCounts );
}